

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testAtomic(FunctionalTest12 *this)

{
  bool bVar1;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  GLuint subroutine_index_01;
  socklen_t sVar2;
  GLchar *pGVar3;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar4;
  bool local_95;
  bool result;
  GLuint read_one;
  GLuint decrement_three;
  GLuint increment_two;
  vertexArray vao;
  program program;
  framebuffer framebuffer;
  undefined1 local_30 [8];
  texture color_texture;
  buffer atomic_buffer;
  FunctionalTest12 *this_local;
  
  Utils::buffer::buffer((buffer *)&color_texture.m_context,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)local_30,(this->super_TestCase).m_context);
  Utils::framebuffer::framebuffer
            ((framebuffer *)&program.m_context,(this->super_TestCase).m_context);
  Utils::program::program((program *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&decrement_three,(this->super_TestCase).m_context);
  iVar4 = 0;
  pGVar3 = testAtomic::geometry_shader_code;
  Utils::program::build
            ((program *)&vao.m_context,(GLchar *)0x0,testAtomic::fragment_shader_code,
             testAtomic::geometry_shader_code,(GLchar *)0x0,(GLchar *)0x0,
             testAtomic::vertex_shader_code,(GLchar **)0x0,0,false);
  sVar2 = (socklen_t)pGVar3;
  Utils::program::use((program *)&vao.m_context);
  Utils::vertexArray::generate((vertexArray *)&decrement_three);
  Utils::vertexArray::bind((vertexArray *)&decrement_three,iVar4,__addr,sVar2);
  Utils::texture::create((texture *)local_30,0x10,0x10,0x8236);
  Utils::buffer::generate((buffer *)&color_texture.m_context);
  Utils::buffer::update
            ((buffer *)&color_texture.m_context,0x92c0,0xc,testAtomic::atomic_buffer_data,0x88e4);
  sVar2 = 0;
  iVar4 = 0x92c0;
  Utils::buffer::bindRange((buffer *)&color_texture.m_context,0x92c0,0,0,0xc);
  Utils::framebuffer::generate((framebuffer *)&program.m_context);
  Utils::framebuffer::bind((framebuffer *)&program.m_context,iVar4,__addr_00,sVar2);
  Utils::framebuffer::attachTexture
            ((framebuffer *)&program.m_context,0x8ce0,local_30._0_4_,0x10,0x10);
  Utils::framebuffer::clearColor((framebuffer *)&program.m_context,0.0,0.0,0.0,0.0);
  Utils::framebuffer::clear((framebuffer *)&program.m_context,0x4000);
  subroutine_index =
       Utils::program::getSubroutineIndex
                 ((program *)&vao.m_context,testAtomic::subroutine_names[0],0x8b30);
  subroutine_index_00 =
       Utils::program::getSubroutineIndex
                 ((program *)&vao.m_context,testAtomic::subroutine_names[1],0x8b30);
  subroutine_index_01 =
       Utils::program::getSubroutineIndex
                 ((program *)&vao.m_context,testAtomic::subroutine_names[2],0x8b30);
  local_95 = testAtomicDraw(this,subroutine_index,testAtomic::expected_incremented_two);
  bVar1 = testAtomicDraw(this,subroutine_index_00,testAtomic::expected_decremented_three);
  if (!bVar1) {
    local_95 = false;
  }
  bVar1 = testAtomicDraw(this,subroutine_index_01,testAtomic::expected_read_one);
  if (!bVar1) {
    local_95 = false;
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&decrement_three);
  Utils::program::~program((program *)&vao.m_context);
  Utils::framebuffer::~framebuffer((framebuffer *)&program.m_context);
  Utils::texture::~texture((texture *)local_30);
  Utils::buffer::~buffer((buffer *)&color_texture.m_context);
  return local_95;
}

Assistant:

bool FunctionalTest12::testAtomic()
{
	static const GLchar* fragment_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_atomic_counters : require\n"
												"#extension GL_ARB_shader_subroutine      : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(location = 0) out uint out_color;\n"
												"\n"
												"layout(binding = 0, offset = 8) uniform atomic_uint one;\n"
												"layout(binding = 0, offset = 4) uniform atomic_uint two;\n"
												"layout(binding = 0, offset = 0) uniform atomic_uint three;\n"
												"\n"
												"subroutine void atomic_routine(void)\n;"
												"\n"
												"subroutine(atomic_routine) void increment_two(void)\n"
												"{\n"
												"    out_color = atomicCounterIncrement(two);\n"
												"}\n"
												"\n"
												"subroutine(atomic_routine) void decrement_three(void)\n"
												"{\n"
												"    out_color = atomicCounterDecrement(three);\n"
												"}\n"
												"\n"
												"subroutine(atomic_routine) void read_one(void)\n"
												"{\n"
												"    out_color = atomicCounter(one);\n"
												"}\n"
												"\n"
												"subroutine uniform atomic_routine routine;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    routine();\n"
												"}\n"
												"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "increment_two", "decrement_three", "read_one" };

	/* Test data */
	static const glw::GLuint atomic_buffer_data[] = { m_texture_width * m_texture_height,
													  m_texture_width * m_texture_height,
													  m_texture_width * m_texture_height };

	static const glw::GLuint expected_incremented_two[] = { atomic_buffer_data[0], 2 * atomic_buffer_data[1],
															atomic_buffer_data[2] };

	static const glw::GLuint expected_decremented_three[] = { 0, expected_incremented_two[1],
															  expected_incremented_two[2] };

	static const glw::GLuint expected_read_one[] = { expected_decremented_three[0], expected_decremented_three[1],
													 expected_decremented_three[2] };

	/* GL objects */
	Utils::buffer	  atomic_buffer(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	color_texture.create(m_texture_width, m_texture_height, GL_R32UI);

	atomic_buffer.generate();
	atomic_buffer.update(GL_ATOMIC_COUNTER_BUFFER, sizeof(atomic_buffer_data), (GLvoid*)atomic_buffer_data,
						 GL_STATIC_DRAW);
	atomic_buffer.bindRange(GL_ATOMIC_COUNTER_BUFFER, 0 /* index */, 0 /* offset */, sizeof(atomic_buffer_data));

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint increment_two   = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint decrement_three = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);
	GLuint read_one		   = program.getSubroutineIndex(subroutine_names[2], GL_FRAGMENT_SHADER);

	/* Test */
	bool result = true;

	if (false == testAtomicDraw(increment_two, expected_incremented_two))
	{
		result = false;
	}

	if (false == testAtomicDraw(decrement_three, expected_decremented_three))
	{
		result = false;
	}

	if (false == testAtomicDraw(read_one, expected_read_one))
	{
		result = false;
	}

	/* Done */
	return result;
}